

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

FuncInfo * PostVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator)

{
  Type *pTVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  ushort uVar4;
  uint uVar5;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  ParseableFunctionInfo *pPVar7;
  Scope *pSVar8;
  Symbol *pSVar9;
  Symbol *pSVar10;
  Utf8SourceInfo *pUVar11;
  ParseNodeBlock *pPVar12;
  code *pcVar13;
  FuncInfo *pFVar14;
  bool bVar15;
  bool bVar16;
  BOOL BVar17;
  RegSlot RVar18;
  Type *ppFVar19;
  Symbol *sym;
  FuncInfo *pFVar20;
  undefined4 *puVar21;
  FunctionBody *pFVar22;
  ParseNodeVar *pPVar23;
  ParseNode *pPVar24;
  ParseNodeParamPattern *pPVar25;
  ParseNodePtr this;
  Scope *pSVar26;
  byte bVar27;
  uint uVar28;
  Type pFVar29;
  anon_class_16_2_de35cfdd handler;
  anon_class_16_2_de35cfdd handler_00;
  uint local_3c;
  FuncInfo *local_38;
  FuncInfo *top;
  
  pSVar6 = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar6->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar6) {
    pFVar29 = (FuncInfo *)0x0;
  }
  else {
    ppFVar19 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&pSVar6->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar29 = *ppFVar19;
  }
  local_38 = pFVar29;
  sym = ParseNodeFnc::GetFuncSymbol(pnodeFnc);
  bVar15 = FuncInfo::IsGlobalFunction(pFVar29);
  pFVar14 = local_38;
  bVar16 = false;
  if ((sym != (Symbol *)0x0) && (!bVar15)) {
    bVar16 = SUB81(((ulong)(byte)sym->field_0x42 & 0xffffffffffffff20) >> 5,0);
  }
  BVar17 = FuncInfo::IsLambda(local_38);
  if (BVar17 == 0) {
    bVar15 = FuncAllowsDirectSuper(local_38,byteCodeGenerator);
    pFVar20 = local_38;
    if (bVar15) goto LAB_00836187;
  }
  else {
    pFVar20 = ByteCodeGenerator::FindEnclosingNonLambda(byteCodeGenerator);
    bVar15 = FuncInfo::IsGlobalFunction(pFVar20);
    if (bVar15) {
      pPVar7 = pFVar14->byteCodeFunction;
      if ((pPVar7->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar21 = 1;
        bVar15 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                            ,0x529,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar15) goto LAB_00836f85;
        *puVar21 = 0;
      }
      if ((ParseableFunctionInfo *)
          (((pPVar7->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar21 = 1;
        bVar15 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                            ,0x52a,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                            "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar15) goto LAB_00836f85;
        *puVar21 = 0;
      }
      pTVar1 = &((pPVar7->super_FunctionProxy).functionInfo.ptr)->attributes;
      *pTVar1 = *pTVar1 | EnclosedByGlobalFunc;
    }
    bVar15 = FuncAllowsDirectSuper(pFVar20,byteCodeGenerator);
    pFVar20 = pFVar14;
    if (bVar15) {
LAB_00836187:
      pTVar1 = &((pFVar20->byteCodeFunction->super_FunctionProxy).functionInfo.ptr)->attributes;
      *pTVar1 = *pTVar1 | AllowDirectSuper;
    }
  }
  if (bVar16 != false) {
    bVar15 = Js::ParseableFunctionInfo::IsFunctionParsed(local_38->byteCodeFunction);
    if ((bVar15) &&
       (pFVar22 = FuncInfo::GetParsedFunctionBody(local_38), (pFVar22->field_0x17a & 0x40) != 0)) {
      *(uint *)&local_38->field_0xb4 = *(uint *)&local_38->field_0xb4 | 0x200;
    }
    if ((sym->field_0x42 & 0x10) != 0) {
      ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,sym);
      *(uint *)&local_38->field_0xb4 = *(uint *)&local_38->field_0xb4 | 0x200;
      pFVar20 = local_38;
      if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
        pFVar22 = FuncInfo::GetParsedFunctionBody(local_38);
        pFVar22->field_0x17a = pFVar22->field_0x17a | 0x40;
      }
      ByteCodeGenerator::ProcessScopeWithCapturedSym((ByteCodeGenerator *)pFVar20,sym->scope);
    }
  }
  if (((((pnodeFnc->super_ParseNode).nop != knopProg) &&
       (pSVar26 = pFVar14->bodyScope, (pSVar26->field_0x44 & 2) == 0)) &&
      (((pFVar14->field_0xb4 & 6) != 0 ||
       ((bVar15 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,pFVar14,pnodeFnc)
        , bVar15 || ((byteCodeGenerator->flags & 0x404) != 0)))))) &&
     (Scope::SetIsObject(pSVar26), (pFVar14->field_0xb5 & 0x80) == 0)) {
    Scope::SetIsObject(pFVar14->paramScope);
  }
  if ((((pnodeFnc->super_ParseNode).nop == knopProg) &&
      (((local_38->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0)) &&
     ((byteCodeGenerator->flags & 0x400) != 0)) {
    Scope::SetIsObject(local_38->bodyScope);
  }
  if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
    bVar15 = FuncInfo::IsGlobalFunction(pFVar14);
    if (!bVar15) {
      pSVar26 = pFVar14->paramScope;
      pSVar8 = pFVar14->bodyScope;
      if ((pSVar26 != (Scope *)0x0) && ((pSVar26->field_0x45 & 1) != 0)) {
        pSVar9 = pSVar26->m_symList;
        while (pSVar10 = pSVar9, pSVar10 != (Symbol *)0x0) {
          pSVar9 = pSVar10->next;
          if ((*(ushort *)&pSVar10->field_0x42 & 0x4010) == 0x10) {
            ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,pSVar10);
          }
        }
        pFVar14->field_0xb4 = pFVar14->field_0xb4 | 0x40;
      }
      if ((pSVar8->field_0x45 & 1) != 0) {
        pSVar9 = pSVar8->m_symList;
        while (pSVar10 = pSVar9, pSVar10 != (Symbol *)0x0) {
          pSVar9 = pSVar10->next;
          if ((*(ushort *)&pSVar10->field_0x42 & 0x4010) == 0x10) {
            ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,pSVar10);
          }
        }
        pFVar14->field_0xb4 = pFVar14->field_0xb4 | 0x40;
      }
      PostVisitBlock(pnodeFnc->pnodeBodyScope,byteCodeGenerator);
      PostVisitBlock(pnodeFnc->pnodeScopes,byteCodeGenerator);
    }
    if (((pnodeFnc->nestedCount != 0) || ((pFVar14->field_0xb4 & 0x82) != 0)) ||
       ((byteCodeGenerator->dynamicScopeCount != 0 || ((byteCodeGenerator->flags & 0x404) != 0)))) {
      ppFVar19 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&byteCodeGenerator->funcInfoStack->
                             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      *(uint *)&(*ppFVar19)->field_0xb4 = *(uint *)&(*ppFVar19)->field_0xb4 | 0x4000;
    }
    bVar15 = FuncInfo::IsGlobalFunction(pFVar14);
    if (bVar15) {
      bVar15 = FuncInfo::IsGlobalFunction(pFVar14);
      if ((!bVar15) && ((pnodeFnc->fncFlags & kFunctionIsModule) == kFunctionNone)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar21 = 1;
        bVar15 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                            ,0xb78,"(top->IsGlobalFunction() || pnodeFnc->IsModule())",
                            "top->IsGlobalFunction() || pnodeFnc->IsModule()");
        if (!bVar15) goto LAB_00836f85;
        *puVar21 = 0;
      }
      if ((((pFVar14->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) &&
         ((byteCodeGenerator->flags & 0x400) != 0)) {
        ppFVar19 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&byteCodeGenerator->funcInfoStack->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        *(uint *)&(*ppFVar19)->field_0xb4 = *(uint *)&(*ppFVar19)->field_0xb4 | 0x4000;
        ByteCodeGenerator::AssignFrameObjRegister(byteCodeGenerator);
        ByteCodeGenerator::AssignFrameDisplayRegister(byteCodeGenerator);
      }
    }
    else {
      uVar5 = *(uint *)&pFVar14->field_0xb4;
      if ((uVar5 & 6) == 0) {
        if ((uVar5 & 8) != 0) {
          bVar15 = ByteCodeGenerator::NeedScopeObjectForArguments
                             (byteCodeGenerator,pFVar14,pnodeFnc);
          if (((uVar5 & 0x40) == 0) && (!bVar15)) goto LAB_00836760;
          goto LAB_00836471;
        }
        if ((uVar5 & 0x40) != 0) goto LAB_00836471;
LAB_00836760:
        if (pFVar14->funcExprScope == (Scope *)0x0) {
          if (-1 < (short)uVar5) goto LAB_00836471;
        }
        else if ((-1 < (short)uVar5) ||
                ((*(ushort *)&pFVar14->funcExprScope->field_0x44 & 0x10) != 0)) goto LAB_00836471;
      }
      else {
LAB_00836471:
        if ((uVar5 & 0x42) == 0x40) {
          ByteCodeGenerator::AssignFrameSlotsRegister(byteCodeGenerator);
        }
        if ((pFVar14->field_0xb5 & 0x80) == 0) {
          ByteCodeGenerator::AssignParamSlotsRegister(byteCodeGenerator);
        }
        if (((((pFVar14->field_0xb4 & 6) != 0) ||
             (bVar15 = ByteCodeGenerator::NeedScopeObjectForArguments
                                 (byteCodeGenerator,pFVar14,pFVar14->root), bVar15)) ||
            ((byteCodeGenerator->flags & 0x404) != 0)) ||
           (((pFVar14->bodyScope->field_0x44 & 2) != 0 ||
            ((pFVar14->paramScope->field_0x44 & 2) != 0)))) {
          ByteCodeGenerator::AssignFrameObjRegister(byteCodeGenerator);
        }
        if ((((*(uint *)&pFVar14->field_0xb4 & 2) != 0) || (pnodeFnc->nestedCount != 0)) ||
           ((((*(uint *)&pFVar14->field_0xb4 & 8) != 0 &&
             (pnodeFnc->pnodeParams != (ParseNodePtr)0x0)) &&
            (((pUVar11 = byteCodeGenerator->m_utf8SourceInfo,
              (pUVar11->debugModeSource).ptr != (uchar *)0x0 || ((pUVar11->field_0xa8 & 0x20) != 0))
             && ((pUVar11->field_0xa8 & 0x40) != 0)))))) {
          ppFVar19 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&byteCodeGenerator->funcInfoStack->
                                 super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
          *(uint *)&(*ppFVar19)->field_0xb4 = *(uint *)&(*ppFVar19)->field_0xb4 | 0x4000;
          ByteCodeGenerator::AssignFrameDisplayRegister(byteCodeGenerator);
        }
      }
      if ((pFVar14->field_0xb4 & 8) != 0) {
        pSVar9 = pFVar14->argumentsSymbol;
        if (pSVar9 == (Symbol *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar21 = 1;
          bVar15 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                              ,0xb46,"(argSym)","argSym");
          if (!bVar15) goto LAB_00836f85;
          *puVar21 = 0;
        }
        else {
          if (pFVar14->bodyScope->scopeSlotCount != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar21 = 1;
            bVar15 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                ,0xb49,"(top->bodyScope->GetScopeSlotCount() == 0)",
                                "top->bodyScope->GetScopeSlotCount() == 0");
            if (!bVar15) goto LAB_00836f85;
            *puVar21 = 0;
          }
          if (pFVar14->argsPlaceHolderSlotCount != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar21 = 1;
            bVar15 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                ,0xb4a,"(top->argsPlaceHolderSlotCount == 0)",
                                "top->argsPlaceHolderSlotCount == 0");
            if (!bVar15) goto LAB_00836f85;
            *puVar21 = 0;
          }
          ByteCodeGenerator::AssignRegister(byteCodeGenerator,pSVar9);
          local_3c = 0;
          bVar15 = ByteCodeGenerator::NeedScopeObjectForArguments
                             (byteCodeGenerator,pFVar14,pnodeFnc);
          if (bVar15) {
            uVar28 = local_3c;
            for (pPVar24 = pnodeFnc->pnodeParams; pPVar24 != (ParseNode *)0x0;
                pPVar24 = ParseNode::GetFormalNext(pPVar24)) {
              if ((byte)(pPVar24->nop + ~knopList) < 3) {
                pPVar23 = ParseNode::AsParseNodeVar(pPVar24);
                pSVar10 = pPVar23->sym;
                if (pSVar10->scopeSlot != -1) {
                  pFVar14->argsPlaceHolderSlotCount = pFVar14->argsPlaceHolderSlotCount + 1;
                }
                pSVar10->scopeSlot = uVar28;
              }
              else if (pPVar24->nop == knopParamPattern) {
                pFVar14->argsPlaceHolderSlotCount = pFVar14->argsPlaceHolderSlotCount + 1;
              }
              uVar28 = uVar28 + 1;
            }
            pPVar24 = pnodeFnc->pnodeRest;
            local_3c = uVar28;
            if (pPVar24 != (ParseNode *)0x0) {
              if ((byte)(pPVar24->nop + ~knopList) < 3) {
                pPVar23 = ParseNode::AsParseNodeVar(pPVar24);
                pSVar10 = pPVar23->sym;
                if (pSVar10->scopeSlot != -1) {
                  pFVar14->argsPlaceHolderSlotCount = pFVar14->argsPlaceHolderSlotCount + 1;
                }
                pSVar10->scopeSlot = local_3c;
              }
              else if (pPVar24->nop == knopParamPattern) {
                pFVar14->argsPlaceHolderSlotCount = pFVar14->argsPlaceHolderSlotCount + 1;
              }
              local_3c = local_3c + 1;
            }
            bVar15 = Symbol::NeedsSlotAlloc(pSVar9,byteCodeGenerator,pFVar14);
            if (bVar15) {
              if (pSVar9->scopeSlot != -1) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar21 = 1;
                bVar15 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                    ,0xb65,"(argSym->GetScopeSlot() == Js::Constants::NoProperty)",
                                    "argSym->GetScopeSlot() == Js::Constants::NoProperty");
                if (!bVar15) goto LAB_00836f85;
                *puVar21 = 0;
              }
              pSVar9->scopeSlot = local_3c;
              local_3c = local_3c + 1;
            }
            this = pnodeFnc->pnodeParams;
            if (this != (ParseNodePtr)0x0) {
              do {
                if (this->nop == knopParamPattern) {
                  pPVar25 = ParseNode::AsParseNodeParamPattern(this);
                  handler.i = &local_3c;
                  handler.top = &local_38;
                  Parser::
                  MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                            ((pPVar25->super_ParseNodeUni).pnode1,handler);
                }
                this = ParseNode::GetFormalNext(this);
              } while (this != (ParseNodePtr)0x0);
            }
            pPVar24 = pnodeFnc->pnodeRest;
            if ((pPVar24 != (ParseNode *)0x0) && (pPVar24->nop == knopParamPattern)) {
              pPVar25 = ParseNode::AsParseNodeParamPattern(pPVar24);
              handler_00.i = &local_3c;
              handler_00.top = &local_38;
              Parser::MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                        ((pPVar25->super_ParseNodeUni).pnode1,handler_00);
            }
          }
          pFVar14 = local_38;
          local_38->paramScope->scopeSlotCount = local_3c;
          if ((local_38->field_0xb4 & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar21 = 1;
            bVar15 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                ,0xb6d,"(top->GetHasHeapArguments())","top->GetHasHeapArguments()");
            if (!bVar15) goto LAB_00836f85;
            *puVar21 = 0;
          }
          bVar15 = ByteCodeGenerator::NeedScopeObjectForArguments
                             (byteCodeGenerator,pFVar14,pnodeFnc);
          if ((bVar15) &&
             ((pnodeFnc->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone)) {
            puVar2 = &(pFVar14->byteCodeFunction->super_FunctionProxy).field_0x47;
            *puVar2 = *puVar2 & 0xfb;
          }
        }
      }
    }
    pFVar14 = local_38;
    if (local_38->newTargetSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,local_38->newTargetSymbol);
    }
    if (pFVar14->thisSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pFVar14->thisSymbol);
      bVar15 = FuncInfo::IsGlobalFunction(pFVar14);
      if (bVar15) {
        ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
      }
    }
    if (pFVar14->superSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pFVar14->superSymbol);
    }
    if (pFVar14->superConstructorSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pFVar14->superConstructorSymbol);
    }
    if (pFVar14->importMetaSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pFVar14->importMetaSymbol);
    }
    if ((sym == (Symbol *)0x0) && (bVar16 == true)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                          ,0xb9f,"(!funcExprWithName || sym)","!funcExprWithName || sym");
      if (!bVar15) goto LAB_00836f85;
      *puVar21 = 0;
    }
    if (bVar16 != false) {
      if (pFVar14->funcExprScope == (Scope *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar21 = 1;
        bVar15 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                            ,0xba2,"(top->funcExprScope)","top->funcExprScope");
        if (!bVar15) goto LAB_00836f85;
        *puVar21 = 0;
      }
      if ((pFVar14->field_0xb4 & 6) != 0) {
        Scope::SetIsObject(pFVar14->funcExprScope);
      }
      pSVar26 = pFVar14->funcExprScope;
      if ((pSVar26->field_0x44 & 2) != 0) {
        ppFVar19 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&byteCodeGenerator->funcInfoStack->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        RVar18 = FuncInfo::NextVarRegister(*ppFVar19);
        pSVar26->location = RVar18;
      }
    }
  }
  ByteCodeGenerator::EndBindFunction(byteCodeGenerator,bVar16);
  bVar16 = FuncInfo::IsGlobalFunction(local_38);
  pFVar14 = local_38;
  if (bVar16) {
    return local_38;
  }
  if ((local_38->field_0xb5 & 0x80) == 0) {
    if ((local_38->bodyScope->field_0x44 & 2) >> 1 != (local_38->paramScope->field_0x44 & 2) >> 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      bVar16 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                          ,0xbc0,"(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject())"
                          ,"top->bodyScope->GetIsObject() == top->paramScope->GetIsObject()");
      if (bVar16) {
        *puVar21 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_00836f85;
    }
  }
  else {
    Scope::MergeParamAndBodyScopes(pnodeFnc);
    Scope::RemoveParamScope(pnodeFnc);
  }
  pSVar6 = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar6->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar6) {
    pFVar29 = (FuncInfo *)0x0;
  }
  else {
    ppFVar19 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&pSVar6->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar29 = *ppFVar19;
  }
  pPVar7 = pFVar29->byteCodeFunction;
  bVar16 = Js::FunctionProxy::IsFunctionBody(&pPVar7->super_FunctionProxy);
  if (!bVar16) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar21 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                        ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar16) goto LAB_00836f85;
    *puVar21 = 0;
  }
  uVar5 = *(uint *)&pPVar7[2].super_FunctionProxy.auxPtrs.ptr;
  if (((pnodeFnc->fncFlags & kFunctionHasHomeObj) != kFunctionNone) &&
     (pnodeFnc->homeObjLocation == 0xffffffff)) {
    if (pFVar29->undefinedConstantRegister == 0xffffffff) {
      RVar18 = FuncInfo::NextConstRegister(pFVar29);
      pFVar29->undefinedConstantRegister = RVar18;
    }
    pnodeFnc->homeObjLocation = pFVar29->undefinedConstantRegister;
  }
  bVar16 = FuncInfo::IsGlobalFunction(pFVar29);
  if (bVar16) {
    if (((byteCodeGenerator->flags & 0x800) != 0) &&
       (byteCodeGenerator->parentScopeInfo == (ScopeInfo *)0x0)) {
      pSVar26 = FuncInfo::GetGlobalEvalBlockScope(pFVar29);
      if ((*(uint *)&pSVar26->field_0x44 >> 8 & 1) != 0) {
        *(ushort *)&pSVar26->field_0x44 = (ushort)*(uint *)&pSVar26->field_0x44 | 0x10;
      }
    }
  }
  else {
    if (((uVar5 >> 0x15 & 1) != 0) &&
       (((ulong)pPVar7[2].super_FunctionProxy.auxPtrs.ptr & 0x100000) != 0)) {
      Scope::SetIsObject(pFVar29->bodyScope);
      Scope::SetIsObject(pFVar29->paramScope);
    }
    bVar16 = ByteCodeGenerator::CanStackNestedFunc(byteCodeGenerator,pFVar14,false);
    if ((((!bVar16) || ((pFVar14->field_0xb4 & 6) != 0)) ||
        (bVar16 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,pFVar14,pnodeFnc)
        , bVar16)) || ((byteCodeGenerator->flags & 0x404) != 0)) {
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar29,L"Child");
    }
  }
  if ((local_38->field_0xb4 & 6) == 0) {
    if ((uVar5 >> 0x15 & 1) == 0) goto LAB_00836e3a;
  }
  else {
    pFVar29->field_0xb4 = pFVar29->field_0xb4 | 4;
    pPVar12 = byteCodeGenerator->currentBlock;
    if (pPVar12 != (ParseNodeBlock *)0x0) {
      if ((pPVar12->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar21 = 1;
        bVar16 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                            ,0xbf5,"(currentBlock->nop == knopBlock)",
                            "currentBlock->nop == knopBlock");
        if (!bVar16) {
LAB_00836f85:
          pcVar13 = (code *)invalidInstructionException();
          (*pcVar13)();
        }
        *puVar21 = 0;
      }
      pPVar12->field_0x5c = pPVar12->field_0x5c | 8;
    }
    pFVar29->field_0xb4 = pFVar29->field_0xb4 | 0x10;
    puVar2 = &(pFVar29->byteCodeFunction->super_FunctionProxy).field_0x45;
    *(ushort *)puVar2 = *(ushort *)puVar2 & 0xdfff;
    pbVar3 = (byte *)((long)&pPVar7[2].super_FunctionProxy.auxPtrs.ptr + 2);
    *pbVar3 = *pbVar3 | 0x20;
    if (local_38->funcExprScope != (Scope *)0x0) {
      Scope::SetIsObject(local_38->funcExprScope);
    }
    if (pFVar29->inArgsCount == 1) {
      ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    }
  }
  if (((ulong)pPVar7[2].super_FunctionProxy.auxPtrs.ptr & 0x8000000) == 0) {
    Scope::ForceAllSymbolNonLocalReference(pFVar29->bodyScope,byteCodeGenerator);
    bVar16 = FuncInfo::IsGlobalFunction(pFVar29);
    if (!bVar16) {
      Scope::ForceAllSymbolNonLocalReference(pFVar29->paramScope,byteCodeGenerator);
    }
    pbVar3 = (byte *)((long)&pPVar7[2].super_FunctionProxy.auxPtrs.ptr + 3);
    *pbVar3 = *pbVar3 | 8;
  }
LAB_00836e3a:
  pFVar14 = local_38;
  if (((pnodeFnc->fncFlags & kFunctionIsGenerator) != kFunctionNone) &&
     (local_38->undefinedConstantRegister == 0xffffffff)) {
    RVar18 = FuncInfo::NextConstRegister(local_38);
    pFVar14->undefinedConstantRegister = RVar18;
  }
  if (((((local_38->root->fncFlags & (kFunctionIsAsync|kFunctionIsLambda|kFunctionIsAccessor)) ==
         kFunctionNone) && ((local_38->field_0xb4 & 6) != 0)) ||
      (BVar17 = FuncInfo::IsClassConstructor(local_38), BVar17 != 0)) &&
     ((BVar17 = FuncInfo::IsBaseClassConstructor(local_38), pFVar14 = local_38, BVar17 == 0 &&
      (local_38->undefinedConstantRegister == 0xffffffff)))) {
    RVar18 = FuncInfo::NextConstRegister(local_38);
    pFVar14->undefinedConstantRegister = RVar18;
  }
  AssignFuncSymRegister(pnodeFnc,byteCodeGenerator,local_38);
  pFVar14 = local_38;
  if ((pnodeFnc->pnodeBody != (ParseNodePtr)0x0) && ((~pnodeFnc->fncFlags & 0x28) == 0)) {
    pPVar7 = local_38->byteCodeFunction;
    uVar4 = *(ushort *)&(pPVar7->super_FunctionProxy).field_0x45;
    uVar5 = *(uint *)&local_38->field_0xb4;
    if ((uVar5 & 0x40) == 0) {
      bVar27 = 0;
    }
    else {
      bVar27 = local_38->paramScope->field_0x45 & 1;
    }
    if (((uVar4 >> 0xd & 1) != 0) && (1 < local_38->inArgsCount)) {
      if (bVar27 == 0) {
        if ((((uVar5 & 0x40) == 0) && ((byteCodeGenerator->flags & 0x400) == 0)) &&
           (((pPVar7->super_FunctionProxy).field_0x47 & 1) == 0)) {
          *(ushort *)&(pPVar7->super_FunctionProxy).field_0x45 = uVar4 & 0xbfff;
        }
      }
      else {
        *(uint *)&local_38->field_0xb4 = uVar5 | 0x10;
        puVar2 = &(pPVar7->super_FunctionProxy).field_0x46;
        *puVar2 = *puVar2 & 0xdf;
        bVar16 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,PerfHintPhase);
        if (bVar16) {
          pFVar22 = FuncInfo::GetParsedFunctionBody(pFVar14);
          WritePerfHint(HeapArgumentsDueToNonLocalRef,pFVar22,0);
        }
      }
    }
  }
  return local_38;
}

Assistant:

FuncInfo* PostVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator)
{
    // Assign function-wide registers such as local frame object, closure environment, etc., based on
    // observed attributes. Propagate attributes to the parent function (if any).
    FuncInfo *top = byteCodeGenerator->TopFuncInfo();
    Symbol *sym = pnodeFnc->GetFuncSymbol();
    bool funcExprWithName = !top->IsGlobalFunction() && sym && sym->GetIsFuncExpr();

    if (top->IsLambda())
    {
        FuncInfo *enclosingNonLambda = byteCodeGenerator->FindEnclosingNonLambda();

        if (enclosingNonLambda->IsGlobalFunction())
        {
            top->byteCodeFunction->SetEnclosedByGlobalFunc();
        }

        if (FuncAllowsDirectSuper(enclosingNonLambda, byteCodeGenerator))
        {
            top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
        }
    }
    else if (FuncAllowsDirectSuper(top, byteCodeGenerator))
    {
        top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
    }

    // If this is a named function expression and has deferred child, mark has non-local reference.
    if (funcExprWithName)
    {
        // If we are reparsing this function due to being in debug mode - we should restore the state of this from the earlier parse
        if (top->byteCodeFunction->IsFunctionParsed() && top->GetParsedFunctionBody()->HasFuncExprNameReference())
        {
            top->SetFuncExprNameReference(true);
        }
        if (sym->GetHasNonLocalReference())
        {
            // Before doing this, though, make sure there's no local symbol that hides the function name
            // from the nested functions. If a lookup starting at the current local scope finds some symbol
            // other than the func expr, then it's hidden. (See Win8 393618.)
            byteCodeGenerator->ProcessCapturedSym(sym);

            top->SetFuncExprNameReference(true);
            if (pnodeFnc->pnodeBody)
            {
                top->GetParsedFunctionBody()->SetFuncExprNameReference(true);
            }
            byteCodeGenerator->ProcessScopeWithCapturedSym(sym->GetScope());
        }
    }

    if (pnodeFnc->nop != knopProg
        && !top->bodyScope->GetIsObject()
        && byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
    {
        // Even if it wasn't determined during visiting this function that we need a scope object, we still have a few conditions that may require one.
        top->bodyScope->SetIsObject();
        if (!top->IsBodyAndParamScopeMerged())
        {
            // If we have the function inside an eval then access to outer variables should go through scope object.
            // So we set the body scope as object and we need to set the param scope also as object in case of split scope.
            top->paramScope->SetIsObject();
        }
    }

    if (pnodeFnc->nop == knopProg
        && top->byteCodeFunction->GetIsStrictMode()
        && (byteCodeGenerator->GetFlags() & fscrEval))
    {
        // At global scope inside a strict mode eval, vars will not leak out and require a scope object (along with its parent.)
        top->bodyScope->SetIsObject();
    }

    if (pnodeFnc->pnodeBody)
    {
        if (!top->IsGlobalFunction())
        {
            auto fnProcess =
                [byteCodeGenerator, top](Symbol *const sym)
                {
                    if (sym->GetHasNonLocalReference() && !sym->GetIsModuleExportStorage())
                    {
                        byteCodeGenerator->ProcessCapturedSym(sym);
                    }
                };

            Scope *bodyScope = top->bodyScope;
            Scope *paramScope = top->paramScope;
            if (paramScope != nullptr)
            {
                if (paramScope->GetHasOwnLocalInClosure())
                {
                    paramScope->ForEachSymbol(fnProcess);
                    top->SetHasLocalInClosure(true);
                }
            }

            if (bodyScope->GetHasOwnLocalInClosure())
            {
                bodyScope->ForEachSymbol(fnProcess);
                top->SetHasLocalInClosure(true);
            }

            PostVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
            PostVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
        }

        // This function refers to the closure environment if:
        // 1. it has a child function (we'll pass the environment to the constructor when the child is created -
        //      even if it's not needed, it's as cheap as loading "null" from the library);
        // 2. it calls eval (and will use the environment to construct the scope chain to pass to eval);
        // 3. it refers to a local defined in a parent function;
        // 4. some parent calls eval;
        // 5. we're in an event handler;
        // 6. the function was declared inside a "with";
        // 7. we're in an eval expression.
        if (pnodeFnc->nestedCount != 0 ||
            top->GetCallsEval() ||
            top->GetHasClosureReference() ||
            byteCodeGenerator->InDynamicScope() ||
            (byteCodeGenerator->GetFlags() & (fscrImplicitThis | fscrEval)))
        {
            byteCodeGenerator->SetNeedEnvRegister();
        }

        // This function needs to construct a local frame on the heap if it is not the global function (even in eval) and:
        // 1. it calls eval, which may refer to or declare any locals in this frame;
        // 2. a child calls eval (which may refer to locals through a closure);
        // 3. it uses non-strict mode "arguments", so the arguments have to be put in a closure;
        // 4. it defines a local that is used by a child function (read from a closure).
        // 5. it is a main function that's wrapped in a function expression scope but has locals used through
        //    a closure (used in forReference function call cases in a with for example).
        if (!top->IsGlobalFunction())
        {
            if (top->GetCallsEval() ||
                top->GetChildCallsEval() ||
                (top->GetHasArguments() && byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)) ||
                top->GetHasLocalInClosure() ||
                (top->funcExprScope && top->funcExprScope->GetMustInstantiate()) ||
                // When we have split scope normally either eval will be present or the GetHasLocalInClosure will be true as one of the formal is
                // captured. But when we force split scope or split scope happens due to some other reasons we have to make sure we allocate frame
                // slot register here.
                (!top->IsBodyAndParamScopeMerged()))
            {
                if (!top->GetCallsEval() && top->GetHasLocalInClosure())
                {
                    byteCodeGenerator->AssignFrameSlotsRegister();
                }

                if (!top->IsBodyAndParamScopeMerged())
                {
                    byteCodeGenerator->AssignParamSlotsRegister();
                }

                if (byteCodeGenerator->NeedObjectAsFunctionScope(top, top->root)
                    || top->bodyScope->GetIsObject()
                    || top->paramScope->GetIsObject())
                {
                    byteCodeGenerator->AssignFrameObjRegister();
                }

                // The function also needs to construct a frame display if:
                // 1. it calls eval;
                // 2. it has a child function.
                // 3. When has arguments and in debug mode. So that frame display be there along with frame object register.
                if (top->GetCallsEval() ||
                    pnodeFnc->nestedCount != 0
                    || (top->GetHasArguments()
                        && (pnodeFnc->pnodeParams != nullptr)
                        && byteCodeGenerator->IsInDebugMode()))
                {
                    byteCodeGenerator->SetNeedEnvRegister(); // This to ensure that Env should be there when the FrameDisplay register is there.
                    byteCodeGenerator->AssignFrameDisplayRegister();
                }
            }

            if (top->GetHasArguments())
            {
                Symbol *argSym = top->GetArgumentsSymbol();
                Assert(argSym);
                if (argSym)
                {
                    Assert(top->bodyScope->GetScopeSlotCount() == 0);
                    Assert(top->argsPlaceHolderSlotCount == 0);
                    byteCodeGenerator->AssignRegister(argSym);
                    uint i = 0;
                    auto setArgScopeSlot = [&](ParseNode *pnodeArg)
                    {
                        if (pnodeArg->IsVarLetOrConst())
                        {
                            Symbol* sym = pnodeArg->AsParseNodeVar()->sym;
                            if (sym->GetScopeSlot() != Js::Constants::NoProperty)
                            {
                                top->argsPlaceHolderSlotCount++; // Same name args appeared before
                            }
                            sym->SetScopeSlot(i);
                        }
                        else if (pnodeArg->nop == knopParamPattern)
                        {
                            top->argsPlaceHolderSlotCount++;
                        }
                        i++;
                    };

                    // We need to include the rest as well -as it will get slot assigned.
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc))
                    {
                        MapFormals(pnodeFnc, setArgScopeSlot);
                        if (argSym->NeedsSlotAlloc(byteCodeGenerator, top))
                        {
                            Assert(argSym->GetScopeSlot() == Js::Constants::NoProperty);
                            argSym->SetScopeSlot(i++);
                        }
                        MapFormalsFromPattern(pnodeFnc, setArgScopeSlot);
                    }

                    top->paramScope->SetScopeSlotCount(i);

                    Assert(top->GetHasHeapArguments());
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)
                        && !pnodeFnc->HasNonSimpleParameterList())
                    {
                        top->byteCodeFunction->SetHasImplicitArgIns(false);
                    }
                }
            }
        }
        else
        {
            Assert(top->IsGlobalFunction() || pnodeFnc->IsModule());
            // eval is called in strict mode
            bool newScopeForEval = (top->byteCodeFunction->GetIsStrictMode() && (byteCodeGenerator->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                byteCodeGenerator->SetNeedEnvRegister();
                byteCodeGenerator->AssignFrameObjRegister();
                byteCodeGenerator->AssignFrameDisplayRegister();
            }
        }

        if (top->GetNewTargetSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetNewTargetSymbol());
        }
        if (top->GetThisSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetThisSymbol());

            // Indirect eval has a 'this' binding and needs to load from null
            if (top->IsGlobalFunction())
            {
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        if (top->GetSuperSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperSymbol());
        }
        if (top->GetSuperConstructorSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperConstructorSymbol());
        }
        if (top->GetImportMetaSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetImportMetaSymbol());
        }

        Assert(!funcExprWithName || sym);
        if (funcExprWithName)
        {
            Assert(top->funcExprScope);
            // If the func expr may be accessed via eval, force the func expr scope into an object.
            if (top->GetCallsEval() || top->GetChildCallsEval())
            {
                top->funcExprScope->SetIsObject();
            }
            if (top->funcExprScope->GetIsObject())
            {
                top->funcExprScope->SetLocation(byteCodeGenerator->NextVarRegister());
            }
        }
    }

    byteCodeGenerator->EndBindFunction(funcExprWithName);

    // If the "child" is the global function, we're done.
    if (top->IsGlobalFunction())
    {
        return top;
    }

    if (top->IsBodyAndParamScopeMerged())
    {
        Scope::MergeParamAndBodyScopes(pnodeFnc);
        Scope::RemoveParamScope(pnodeFnc);
    }
    else
    {
        // A param and body scope exist for the same function, they
        // should both either be using scope slots or scope objects.
        Assert_FailFast(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject());
    }

    FuncInfo* const parentFunc = byteCodeGenerator->TopFuncInfo();

    Js::FunctionBody * parentFunctionBody = parentFunc->byteCodeFunction->GetFunctionBody();
    Assert(parentFunctionBody != nullptr);
    bool setHasNonLocalReference = parentFunctionBody->HasAllNonLocalReferenced();

    // This is required for class constructors as will be able to determine the actual home object register only after emitting InitClass
    if (pnodeFnc->HasHomeObj() && pnodeFnc->GetHomeObjLocation() == Js::Constants::NoRegister)
    {
        pnodeFnc->SetHomeObjLocation(parentFunc->AssignUndefinedConstRegister());
    }

    // If we have any deferred child, we need to instantiate the fake global block scope if it is not empty
    if (parentFunc->IsGlobalFunction())
    {
        if (byteCodeGenerator->IsEvalWithNoParentScopeInfo())
        {
            Scope * globalEvalBlockScope = parentFunc->GetGlobalEvalBlockScope();
            if (globalEvalBlockScope->GetHasOwnLocalInClosure())
            {
                globalEvalBlockScope->SetMustInstantiate(true);
            }
        }
    }
    else
    {
        if (setHasNonLocalReference)
        {
            // All locals are already marked as non-locals-referenced. Mark the parent as well.
            if (parentFunctionBody->HasSetIsObject())
            {
                // Updated the current function, as per the previous stored info.
                parentFunc->GetBodyScope()->SetIsObject();
                parentFunc->GetParamScope()->SetIsObject();
            }
        }
        // Propagate HasMaybeEscapedNestedFunc
        if (!byteCodeGenerator->CanStackNestedFunc(top, false) ||
            byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
        {
            parentFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Child")));
        }
    }

    if (top->GetCallsEval() || top->GetChildCallsEval())
    {
        parentFunc->SetChildCallsEval(true);
        ParseNodeBlock *currentBlock = byteCodeGenerator->GetCurrentBlock();
        if (currentBlock)
        {
            Assert(currentBlock->nop == knopBlock);
            currentBlock->SetChildCallsEval(true);
        }
        parentFunc->SetHasHeapArguments(true);
        setHasNonLocalReference = true;
        parentFunctionBody->SetAllNonLocalReferenced(true);

        Scope * const funcExprScope = top->funcExprScope;
        if (funcExprScope)
        {
            // If we have the body scope as an object, the outer function expression scope also needs to be an object to propagate the name.
            funcExprScope->SetIsObject();
        }

        if (parentFunc->inArgsCount == 1)
        {
            // If no formals to function, no need to create the propertyid array
            byteCodeGenerator->AssignNullConstRegister();
        }
    }

    if (setHasNonLocalReference && !parentFunctionBody->HasDoneAllNonLocalReferenced())
    {
        parentFunc->GetBodyScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        if (!parentFunc->IsGlobalFunction())
        {
            parentFunc->GetParamScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        }
        parentFunctionBody->SetHasDoneAllNonLocalReferenced(true);
    }

    if (pnodeFnc->IsGenerator())
    {
        top->AssignUndefinedConstRegister();
    }

    if ((top->root->IsConstructor() && (top->GetCallsEval() || top->GetChildCallsEval())) || top->IsClassConstructor())
    {
        if (!top->IsBaseClassConstructor())
        {
            // Derived class constructors need to check undefined against explicit return statements.
            top->AssignUndefinedConstRegister();
        }
    }

    AssignFuncSymRegister(pnodeFnc, byteCodeGenerator, top);

    if (pnodeFnc->pnodeBody && pnodeFnc->HasReferenceableBuiltInArguments() && pnodeFnc->UsesArguments() &&
        pnodeFnc->HasHeapArguments())
    {
        bool doStackArgsOpt = top->byteCodeFunction->GetDoBackendArgumentsOptimization();

        bool hasAnyParamInClosure = top->GetHasLocalInClosure() && top->GetParamScope()->GetHasOwnLocalInClosure();

        if ((doStackArgsOpt && top->inArgsCount > 1))
        {
            if (doStackArgsOpt && hasAnyParamInClosure)
            {
                top->SetHasHeapArguments(true, false /*= Optimize arguments in backend*/);
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase))
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToNonLocalRef, top->GetParsedFunctionBody(), 0);
                }
#endif
            }
            else if (!top->GetHasLocalInClosure() && !(byteCodeGenerator->GetFlags() & fscrEval) && !top->byteCodeFunction->IsEval())
            {
                //Scope object creation instr will be a MOV NULL instruction in the Lowerer - if we still decide to do StackArgs after Globopt phase.
                //Note that if we're in eval, scoped ldfld/stfld will traverse the whole frame display, including this slot, so it can't be null.
                top->byteCodeFunction->SetDoScopeObjectCreation(false);
            }
        }
    }
    return top;
}